

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O2

void __thiscall chrono::ChPhysicsItem::Update(ChPhysicsItem *this,double mytime,bool update_assets)

{
  pointer psVar1;
  ChVisualModelInstance *this_00;
  undefined7 in_register_00000031;
  shared_ptr<chrono::ChCamera> *camera;
  pointer psVar2;
  ChFrame<double> local_a0;
  
  (this->super_ChObj).ChTime = mytime;
  if ((int)CONCAT71(in_register_00000031,update_assets) != 0) {
    psVar1 = (this->cameras).
             super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = (this->cameras).
                  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      (*((psVar2->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_ChCamera[2])();
    }
    this_00 = (this->vis_model_instance).
              super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (ChVisualModelInstance *)0x0) {
      (*(this->super_ChObj)._vptr_ChObj[7])(&local_a0,this,0);
      ChVisualModelInstance::Update(this_00,&local_a0);
    }
  }
  return;
}

Assistant:

void ChPhysicsItem::Update(double mytime, bool update_assets) {
    ChTime = mytime;

    if (update_assets) {
        for (auto& camera : cameras)
            camera->Update();
        if (vis_model_instance)
            vis_model_instance->Update(GetVisualModelFrame());
    }
}